

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hpp
# Opt level: O2

Color __thiscall plot::Color::over(Color *this,Color *other)

{
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  Color CVar4;
  Color CVar5;
  Color CVar6;
  float local_38;
  float fStack_34;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  CVar4 = premultiplied(this);
  CVar5 = premultiplied(other);
  fVar3 = 1.0 - this->a;
  local_38 = CVar4.b;
  fStack_34 = CVar4.a;
  CVar6.a = CVar5.a * fVar3 + fStack_34;
  local_28 = CVar4.r;
  fStack_24 = CVar4.g;
  fStack_20 = (float)extraout_XMM0_Qb;
  fStack_1c = (float)((ulong)extraout_XMM0_Qb >> 0x20);
  auVar1._0_4_ = CVar5.r * fVar3 + local_28;
  auVar1._4_4_ = CVar5.g * fVar3 + fStack_24;
  auVar1._8_4_ = (float)extraout_XMM0_Qb_00 * fVar3 + fStack_20;
  auVar1._12_4_ = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20) * fVar3 + fStack_1c;
  auVar2._4_4_ = CVar6.a;
  auVar2._0_4_ = CVar6.a;
  auVar2._8_4_ = CVar6.a;
  auVar2._12_4_ = CVar6.a;
  auVar2 = divps(auVar1,auVar2);
  CVar6.b = (CVar5.b * fVar3 + local_38) / CVar6.a;
  CVar6._0_8_ = auVar2._0_8_;
  return CVar6;
}

Assistant:

constexpr Color over(Color const& other) const {
        return (premultiplied() + other.premultiplied()*(1.0f - a)).unpremultiplied();
    }